

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void nlohmann::detail::
     serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     ::escape_codepoint(int codepoint,string_t *result,size_t *pos)

{
  char cVar1;
  size_t sVar2;
  pointer pcVar3;
  uint uVar4;
  
  if (0x10ffff < (uint)codepoint) {
    __assert_fail("0x00 <= codepoint and codepoint <= 0x10FFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp",
                  0x1917,
                  "static void nlohmann::detail::serializer<nlohmann::basic_json<>>::escape_codepoint(int, string_t &, std::size_t &) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  sVar2 = *pos;
  pcVar3 = (result->_M_dataplus)._M_p;
  if (pcVar3[sVar2] == '\\') {
    *pos = sVar2 + 1;
    pcVar3[sVar2 + 1] = 'u';
    if (codepoint < 0x10000) {
      cVar1 = escape_codepoint::hexify._M_elems[(uint)codepoint >> 0xc & 0xf];
      sVar2 = *pos;
      *pos = sVar2 + 1;
      (result->_M_dataplus)._M_p[sVar2 + 1] = cVar1;
      uVar4 = (uint)codepoint >> 8 & 0xf;
    }
    else {
      sVar2 = *pos;
      *pos = sVar2 + 1;
      (result->_M_dataplus)._M_p[sVar2 + 1] = 'd';
      cVar1 = escape_codepoint::hexify._M_elems[(ulong)(codepoint - 0x10000U >> 0x12 & 3) + 8];
      sVar2 = *pos;
      *pos = sVar2 + 1;
      (result->_M_dataplus)._M_p[sVar2 + 1] = cVar1;
      cVar1 = escape_codepoint::hexify._M_elems[codepoint - 0x10000U >> 0xe & 0xf];
      sVar2 = *pos;
      *pos = sVar2 + 1;
      (result->_M_dataplus)._M_p[sVar2 + 1] = cVar1;
      cVar1 = escape_codepoint::hexify._M_elems[(uint)codepoint >> 10 & 0xf];
      sVar2 = *pos;
      *pos = sVar2 + 1;
      (result->_M_dataplus)._M_p[sVar2 + 1] = cVar1;
      sVar2 = *pos;
      *pos = sVar2 + 2;
      (result->_M_dataplus)._M_p[sVar2 + 2] = 'u';
      sVar2 = *pos;
      *pos = sVar2 + 1;
      (result->_M_dataplus)._M_p[sVar2 + 1] = 'd';
      uVar4 = (uint)codepoint >> 8 & 3 | 0xc;
    }
    cVar1 = escape_codepoint::hexify._M_elems[uVar4];
    sVar2 = *pos;
    *pos = sVar2 + 1;
    (result->_M_dataplus)._M_p[sVar2 + 1] = cVar1;
    cVar1 = escape_codepoint::hexify._M_elems[(uint)codepoint >> 4 & 0xf];
    sVar2 = *pos;
    *pos = sVar2 + 1;
    (result->_M_dataplus)._M_p[sVar2 + 1] = cVar1;
    cVar1 = escape_codepoint::hexify._M_elems[codepoint & 0xf];
    sVar2 = *pos;
    *pos = sVar2 + 1;
    (result->_M_dataplus)._M_p[sVar2 + 1] = cVar1;
    *pos = *pos + 1;
    return;
  }
  __assert_fail("result[pos] == \'\\\\\'",
                "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp",
                0x191a,
                "static void nlohmann::detail::serializer<nlohmann::basic_json<>>::escape_codepoint(int, string_t &, std::size_t &) [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

static void escape_codepoint(int codepoint, string_t& result, std::size_t& pos)
    {
        // expecting a proper codepoint
        assert(0x00 <= codepoint and codepoint <= 0x10FFFF);

        // the last written character was the backslash before the 'u'
        assert(result[pos] == '\\');

        // write the 'u'
        result[++pos] = 'u';

        // convert a number 0..15 to its hex representation (0..f)
        static const std::array<char, 16> hexify =
        {
            {
                '0', '1', '2', '3', '4', '5', '6', '7',
                '8', '9', 'a', 'b', 'c', 'd', 'e', 'f'
            }
        };

        if (codepoint < 0x10000)
        {
            // codepoints U+0000..U+FFFF can be represented as \uxxxx.
            result[++pos] = hexify[(codepoint >> 12) & 0x0F];
            result[++pos] = hexify[(codepoint >> 8) & 0x0F];
            result[++pos] = hexify[(codepoint >> 4) & 0x0F];
            result[++pos] = hexify[codepoint & 0x0F];
        }
        else
        {
            // codepoints U+10000..U+10FFFF need a surrogate pair to be
            // represented as \uxxxx\uxxxx.
            // http://www.unicode.org/faq/utf_bom.html#utf16-4
            codepoint -= 0x10000;
            const int high_surrogate = 0xD800 | ((codepoint >> 10) & 0x3FF);
            const int low_surrogate = 0xDC00 | (codepoint & 0x3FF);
            result[++pos] = hexify[(high_surrogate >> 12) & 0x0F];
            result[++pos] = hexify[(high_surrogate >> 8) & 0x0F];
            result[++pos] = hexify[(high_surrogate >> 4) & 0x0F];
            result[++pos] = hexify[high_surrogate & 0x0F];
            ++pos;  // backslash is already in output
            result[++pos] = 'u';
            result[++pos] = hexify[(low_surrogate >> 12) & 0x0F];
            result[++pos] = hexify[(low_surrogate >> 8) & 0x0F];
            result[++pos] = hexify[(low_surrogate >> 4) & 0x0F];
            result[++pos] = hexify[low_surrogate & 0x0F];
        }

        ++pos;
    }